

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.c
# Opt level: O0

_Bool mi_heap_page_check_owned
                (mi_heap_t *heap,mi_page_queue_t *pq,mi_page_t *page,void *p,void *vfound)

{
  ushort uVar1;
  uint8_t *puVar2;
  size_t sVar3;
  uint8_t *in_RCX;
  mi_page_t *in_RDX;
  byte *in_R8;
  void *end;
  void *start;
  _Bool *found;
  bool local_41;
  
  puVar2 = mi_page_start(in_RDX);
  uVar1 = in_RDX->capacity;
  sVar3 = mi_page_block_size(in_RDX);
  local_41 = puVar2 <= in_RCX && in_RCX < puVar2 + uVar1 * sVar3;
  *in_R8 = local_41;
  return (_Bool)((*in_R8 ^ 0xff) & 1);
}

Assistant:

static bool mi_heap_page_check_owned(mi_heap_t* heap, mi_page_queue_t* pq, mi_page_t* page, void* p, void* vfound) {
  MI_UNUSED(heap);
  MI_UNUSED(pq);
  bool* found = (bool*)vfound;
  void* start = mi_page_start(page);
  void* end   = (uint8_t*)start + (page->capacity * mi_page_block_size(page));
  *found = (p >= start && p < end);
  return (!*found); // continue if not found
}